

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  double dVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  GCObject *pGVar5;
  TValue *f;
  lua_CFunction p_Var6;
  uint uVar7;
  Table *pTVar8;
  GCObject *pGVar9;
  bool bVar10;
  double dVar11;
  
  bVar2 = t1->tt_;
  bVar3 = t2->tt_;
  if ((bVar2 & 0x3f) != (bVar3 & 0x3f)) {
    if ((bVar3 & 0xf) != 3 || (bVar2 & 0xf) != 3) {
      return 0;
    }
    if (bVar2 == 3) {
      pGVar9 = (t1->value_).gc;
    }
    else {
      if (bVar2 != 0x13) {
        return 0;
      }
      dVar1 = (t1->value_).n;
      dVar11 = floor(dVar1);
      if (dVar11 != dVar1) {
        return 0;
      }
      if (dVar11 < -9.223372036854776e+18) {
        return 0;
      }
      if (9.223372036854776e+18 <= dVar11) {
        return 0;
      }
      pGVar9 = (GCObject *)(long)dVar11;
    }
    if (bVar3 == 3) {
      pGVar5 = (t2->value_).gc;
    }
    else {
      if (bVar3 != 0x13) {
        return 0;
      }
      dVar1 = (t2->value_).n;
      dVar11 = floor(dVar1);
      if (dVar11 != dVar1) {
        return 0;
      }
      if (dVar11 < -9.223372036854776e+18) {
        return 0;
      }
      if (9.223372036854776e+18 <= dVar11) {
        return 0;
      }
      pGVar5 = (GCObject *)(long)dVar11;
    }
    bVar10 = pGVar9 == pGVar5;
LAB_001550bd:
    return (uint)bVar10;
  }
  uVar7 = 1;
  switch(bVar2 & 0x3f) {
  case 0:
  case 1:
  case 0x11:
    goto switchD_001550b3_caseD_0;
  default:
    bVar10 = (t1->value_).gc == (t2->value_).gc;
    goto LAB_001550bd;
  case 5:
    p_Var6 = (t2->value_).f;
    if ((t1->value_).f == p_Var6) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar8 = *(Table **)((t1->value_).f + 0x28);
    if ((pTVar8 == (Table *)0x0) || ((pTVar8->flags & 0x20) != 0)) {
LAB_00155246:
      pTVar8 = *(Table **)(p_Var6 + 0x28);
      goto LAB_0015524a;
    }
    f = luaT_gettm(pTVar8,TM_EQ,L->l_G->tmname[5]);
    if (f == (TValue *)0x0) {
      p_Var6 = (t2->value_).f;
      goto LAB_00155246;
    }
    break;
  case 7:
    p_Var6 = (t2->value_).f;
    if ((t1->value_).f == p_Var6) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar8 = *(Table **)((t1->value_).f + 0x18);
    if ((pTVar8 != (Table *)0x0) && ((pTVar8->flags & 0x20) == 0)) {
      f = luaT_gettm(pTVar8,TM_EQ,L->l_G->tmname[5]);
      if (f != (TValue *)0x0) break;
      p_Var6 = (t2->value_).f;
    }
    pTVar8 = *(Table **)(p_Var6 + 0x18);
LAB_0015524a:
    if (pTVar8 == (Table *)0x0) {
      return 0;
    }
    if ((pTVar8->flags & 0x20) != 0) {
      return 0;
    }
    f = luaT_gettm(pTVar8,TM_EQ,L->l_G->tmname[5]);
    if (f == (TValue *)0x0) {
      return 0;
    }
    break;
  case 0x13:
    return -(uint)((t2->value_).n == (t1->value_).n) & 1;
  case 0x14:
    iVar4 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    return iVar4;
  }
  luaT_callTMres(L,f,t1,t2,(L->top).p);
  bVar2 = *(byte *)((L->top).offset + 8);
  uVar7 = (uint)((bVar2 & 0xf) != 0 && bVar2 != 1);
switchD_001550b3_caseD_0:
  return uVar7;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttypetag(t1) != ttypetag(t2)) {  /* not the same variant? */
    if (ttype(t1) != ttype(t2) || ttype(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      /* One of them is an integer. If the other does not have an
         integer value, they cannot be equal; otherwise, compare their
         integer values. */
      lua_Integer i1, i2;
      return (luaV_tointegerns(t1, &i1, F2Ieq) &&
              luaV_tointegerns(t2, &i2, F2Ieq) &&
              i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttypetag(t1)) {
    case LUA_VNIL: case LUA_VFALSE: case LUA_VTRUE: return 1;
    case LUA_VNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_VNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_VLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_VLCF: return fvalue(t1) == fvalue(t2);
    case LUA_VSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_VLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_VUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_VTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  else {
    luaT_callTMres(L, tm, t1, t2, L->top.p);  /* call TM */
    return !l_isfalse(s2v(L->top.p));
  }
}